

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManUpdateCopy(Vec_Int_t *vCopy,Gia_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  
  if (0 < vCopy->nSize) {
    piVar2 = vCopy->pArray;
    lVar3 = 0;
    do {
      uVar1 = piVar2[lVar3];
      if (uVar1 != 0xffffffff) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (p->nObjs <= (int)(uVar1 >> 1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar4 = p->pObjs[uVar1 >> 1].Value;
        if (uVar4 == 0xffffffff) {
          uVar4 = 0xffffffff;
        }
        else {
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = uVar4 ^ uVar1 & 1;
        }
        piVar2[lVar3] = uVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCopy->nSize);
  }
  return;
}

Assistant:

void Gia_ManUpdateCopy( Vec_Int_t * vCopy, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, iLit;
    Vec_IntForEachEntry( vCopy, iLit, i )
    {
        if ( iLit == -1 )
            continue;
        pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( !~pObj->Value )
            Vec_IntWriteEntry( vCopy, i, -1 );
        else
            Vec_IntWriteEntry( vCopy, i, Abc_LitNotCond(pObj->Value, Abc_LitIsCompl(iLit)) );
    }
}